

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O2

void __thiscall TcpConn::~TcpConn(TcpConn *this)

{
  Poller *this_00;
  
  (this->super_PollObj)._vptr_PollObj = (_func_int **)&PTR__TcpConn_00108cf0;
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR_Alloc_00108d58;
  this_00 = (this->super_PollObj).m_pPoller;
  if (this_00 != (Poller *)0x0) {
    Poller::Remove(this_00,&this->super_PollObj);
  }
  Buffer::Clear(&this->super_Buffer);
  Socket::~Socket(&(this->m_socket).super_Socket);
  return;
}

Assistant:

TcpConn::~TcpConn()
{
    if(this->m_pPoller != nullptr)
        m_pPoller->Remove(this);
    Clear();
}